

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O2

void sptk::world::dctsub(int n,double *a,int nc,double *c)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  
  lVar4 = (long)n;
  lVar6 = (long)(nc / n);
  lVar3 = (long)(n >> 1);
  pdVar5 = c + (nc - lVar6);
  pdVar7 = c + lVar6;
  for (lVar8 = 1; lVar4 = lVar4 + -1, lVar8 < lVar3; lVar8 = lVar8 + 1) {
    dVar10 = *pdVar7 - *pdVar5;
    dVar9 = *pdVar7 + *pdVar5;
    dVar1 = a[lVar8];
    dVar2 = a[lVar4];
    a[lVar8] = dVar10 * dVar1 + dVar9 * dVar2;
    a[lVar4] = dVar9 * dVar1 - dVar2 * dVar10;
    pdVar5 = pdVar5 + -lVar6;
    pdVar7 = pdVar7 + lVar6;
  }
  a[lVar3] = *c * a[lVar3];
  return;
}

Assistant:

void dctsub(int n, double *a, int nc, double *c) {
  int j, k, kk, ks, m;
  double wkr, wki, xr;

  m = n >> 1;
  ks = nc / n;
  kk = 0;
  for (j = 1; j < m; j++) {
    k = n - j;
    kk += ks;
    wkr = c[kk] - c[nc - kk];
    wki = c[kk] + c[nc - kk];
    xr = wki * a[j] - wkr * a[k];
    a[j] = wkr * a[j] + wki * a[k];
    a[k] = xr;
  }
  a[m] *= c[0];
}